

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

QByteArray * QTimeZone::systemTimeZoneId(void)

{
  QArrayData *pQVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  longlong __old_val;
  Type *pTVar4;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *this;
  long in_FS_OFFSET;
  QArrayData *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *)&local_38
  ;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
           operator->(in_RDI);
  (*((pTVar4->backend).d.ptr)->_vptr_QTimeZonePrivate[0x13])();
  puVar3 = local_28;
  puVar2 = puStack_30;
  pQVar1 = local_38;
  if (local_28 == (undefined1 *)0x0) {
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
             operator->(this);
    QTimeZonePrivate::id((pTVar4->backend).d.ptr);
  }
  else {
    local_38 = (QArrayData *)0x0;
    puStack_30 = (undefined1 *)0x0;
    *(QArrayData **)in_RDI = pQVar1;
    *(undefined1 **)(in_RDI + 8) = puVar2;
    local_28 = (undefined1 *)0x0;
    *(undefined1 **)(in_RDI + 0x10) = puVar3;
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZone::systemTimeZoneId()
{
    QByteArray sys = global_tz->backend->systemTimeZoneId();
    if (!sys.isEmpty())
        return sys;
    // The system zone, despite the empty ID, may know its real ID anyway:
    return global_tz->backend->id();
}